

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::func_type_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type)

{
  ulong *puVar1;
  char **ppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  bool bVar5;
  undefined8 *puVar6;
  SPIRVariable *var;
  SPIRType *pSVar7;
  SPIREntryPoint *pSVar8;
  long *plVar9;
  runtime_error *prVar10;
  ulong uVar11;
  char *pcVar12;
  size_type *psVar13;
  undefined8 uVar14;
  char (*pacVar15) [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string entry_type;
  string return_type;
  char (*in_stack_ffffffffffffff48) [12];
  string local_b0;
  char **local_90;
  char (*local_88) [12];
  char *local_80;
  undefined8 uStack_78;
  ulong *local_70;
  size_type local_68;
  ulong local_60;
  undefined8 uStack_58;
  char **local_50;
  long local_48;
  char *local_40 [2];
  
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_90,this,type,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&local_b0,this,type);
  pcVar12 = (char *)0xf;
  if (local_90 != &local_80) {
    pcVar12 = local_80;
  }
  pacVar15 = local_88;
  if (pcVar12 < *local_88 + (long)(char *)local_b0._M_string_length) {
    uVar14 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar14 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < *local_88 + (long)(char *)local_b0._M_string_length) goto LAB_002d471a;
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_002d471a:
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
  }
  local_70 = &local_60;
  puVar1 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar1) {
    local_60 = *puVar1;
    uStack_58 = puVar6[3];
  }
  else {
    local_60 = *puVar1;
    local_70 = (ulong *)*puVar6;
  }
  local_68 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  paVar3 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((this->super_CompilerGLSL).processing_entry_point == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_70 == &local_60) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_60;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_58;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_60;
    }
    __return_storage_ptr__->_M_string_length = local_68;
    local_68 = 0;
    local_60 = local_60 & 0xffffffffffffff00;
    local_70 = &local_60;
    goto LAB_002d4ad0;
  }
  bVar5 = get_is_rasterization_disabled(this);
  uVar11 = (ulong)(this->stage_out_var_id).id;
  if (!bVar5 && uVar11 != 0) {
    var = Variant::get<spirv_cross::SPIRVariable>
                    ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr + uVar11);
    pSVar7 = Compiler::get_variable_data_type((Compiler *)this,var);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_b0,this,pSVar7,0);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&local_50,this,type);
    uVar14 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      uVar14 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (char *)local_b0._M_string_length + local_48) {
      pcVar12 = (char *)0xf;
      if (local_50 != local_40) {
        pcVar12 = local_40[0];
      }
      if (pcVar12 < (char *)local_b0._M_string_length + local_48) goto LAB_002d4855;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      pacVar15 = (char (*) [12])local_b0._M_string_length;
    }
    else {
LAB_002d4855:
      puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50);
      pacVar15 = (char (*) [12])local_b0._M_string_length;
    }
    ppcVar2 = (char **)(puVar6 + 2);
    if ((char **)*puVar6 == ppcVar2) {
      local_80 = *ppcVar2;
      uStack_78 = puVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *ppcVar2;
      local_90 = (char **)*puVar6;
    }
    local_88 = (char (*) [12])puVar6[1];
    *puVar6 = ppcVar2;
    puVar6[1] = 0;
    *(undefined1 *)ppcVar2 = 0;
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  local_88 = (char (*) [12])0x0;
  local_80 = (char *)((ulong)local_80 & 0xffffffffffffff00);
  local_90 = &local_80;
  pSVar8 = Compiler::get_entry_point((Compiler *)this);
  switch(pSVar8->model) {
  case ExecutionModelVertex:
    bVar5 = (this->msl_options).vertex_for_tessellation;
    if ((bVar5 == true) && ((this->msl_options).msl_version < 0x27d8)) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Tessellation requires Metal 1.2.","");
      ::std::runtime_error::runtime_error(prVar10,(string *)&local_b0);
      *(undefined ***)prVar10 = &PTR__runtime_error_003fce08;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar12 = "vertex";
    if (bVar5 != false) {
      pcVar12 = "kernel";
    }
    break;
  case ExecutionModelTessellationControl:
    if ((this->msl_options).msl_version < 0x27d8) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Tessellation requires Metal 1.2.","");
      ::std::runtime_error::runtime_error(prVar10,(string *)&local_b0);
      *(undefined ***)prVar10 = &PTR__runtime_error_003fce08;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((pSVar8->flags).lower & 0x2000000) != 0) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Metal does not support isoline tessellation.","");
      ::std::runtime_error::runtime_error(prVar10,(string *)&local_b0);
      *(undefined ***)prVar10 = &PTR__runtime_error_003fce08;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case ExecutionModelGLCompute:
  case ExecutionModelKernel:
    pcVar12 = "kernel";
    break;
  case ExecutionModelTessellationEvaluation:
    if ((this->msl_options).msl_version < 0x27d8) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Tessellation requires Metal 1.2.","");
      ::std::runtime_error::runtime_error(prVar10,(string *)&local_b0);
      *(undefined ***)prVar10 = &PTR__runtime_error_003fce08;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((pSVar8->flags).lower & 0x2000000) != 0) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Metal does not support isoline tessellation.","");
      ::std::runtime_error::runtime_error(prVar10,(string *)&local_b0);
      *(undefined ***)prVar10 = &PTR__runtime_error_003fce08;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->msl_options).platform == iOS) {
      bVar5 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_50 = (char **)0x363428;
      if (bVar5) {
        local_50 = (char **)0x368478;
      }
      join<char_const(&)[10],char_const*,char_const(&)[12]>
                (&local_b0,(spirv_cross *)"[[ patch(",(char (*) [10])&local_50,
                 (char **)") ]] vertex",pacVar15);
    }
    else {
      bVar5 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_50 = (char **)0x363428;
      if (bVar5) {
        local_50 = (char **)0x368478;
      }
      join<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
                (&local_b0,(spirv_cross *)"[[ patch(",(char (*) [10])&local_50,(char **)0x37aab7,
                 (char (*) [3])&pSVar8->output_vertices,(uint *)") ]] vertex",
                 in_stack_ffffffffffffff48);
    }
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    goto LAB_002d4a34;
  default:
    pcVar12 = "unknown";
    break;
  case ExecutionModelFragment:
    bVar5 = uses_explicit_early_fragment_test(this);
    pcVar12 = "fragment";
    if (bVar5) {
      pcVar12 = "[[ early_fragment_tests ]] fragment";
    }
  }
  ::std::__cxx11::string::_M_replace((ulong)&local_90,0,*local_88,(ulong)pcVar12);
LAB_002d4a34:
  local_b0._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_90,*local_88 + (long)local_90);
  ::std::__cxx11::string::append((char *)&local_b0);
  plVar9 = (long *)::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar13 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar13) {
    lVar4 = plVar9[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
  }
  __return_storage_ptr__->_M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
LAB_002d4ad0:
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::func_type_decl(SPIRType &type)
{
	// The regular function return type. If not processing the entry point function, that's all we need
	string return_type = type_to_glsl(type) + type_to_array_glsl(type);
	if (!processing_entry_point)
		return return_type;

	// If an outgoing interface block has been defined, and it should be returned, override the entry point return type
	bool ep_should_return_output = !get_is_rasterization_disabled();
	if (stage_out_var_id && ep_should_return_output)
		return_type = type_to_glsl(get_stage_out_struct_type()) + type_to_array_glsl(type);

	// Prepend a entry type, based on the execution model
	string entry_type;
	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (msl_options.vertex_for_tessellation && !msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		entry_type = msl_options.vertex_for_tessellation ? "kernel" : "vertex";
		break;
	case ExecutionModelTessellationEvaluation:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		if (msl_options.is_ios())
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ") ]] vertex");
		else
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ", ",
			                  execution.output_vertices, ") ]] vertex");
		break;
	case ExecutionModelFragment:
		entry_type = uses_explicit_early_fragment_test() ? "[[ early_fragment_tests ]] fragment" : "fragment";
		break;
	case ExecutionModelTessellationControl:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		/* fallthrough */
	case ExecutionModelGLCompute:
	case ExecutionModelKernel:
		entry_type = "kernel";
		break;
	default:
		entry_type = "unknown";
		break;
	}

	return entry_type + " " + return_type;
}